

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void set_wall_state(level *lev)

{
  rm *local_28;
  rm *loc;
  int local_18;
  int wmode;
  int y;
  int x;
  level *lev_local;
  
  for (wmode = 0; wmode < 0x50; wmode = wmode + 1) {
    local_28 = lev->locations[wmode];
    for (local_18 = 0; local_18 < 0x15; local_18 = local_18 + 1) {
      switch(local_28->typ) {
      case '\x01':
        loc._4_4_ = set_wall(lev,wmode,local_18,0);
        break;
      case '\x02':
        loc._4_4_ = set_wall(lev,wmode,local_18,1);
        break;
      case '\x03':
        loc._4_4_ = set_corn(lev,wmode + -1,local_18 + -1,wmode,local_18 + -1,wmode + -1,local_18,
                             wmode + 1,local_18 + 1);
        break;
      case '\x04':
        loc._4_4_ = set_corn(lev,wmode,local_18 + -1,wmode + 1,local_18 + -1,wmode + 1,local_18,
                             wmode + -1,local_18 + 1);
        break;
      case '\x05':
        loc._4_4_ = set_corn(lev,wmode,local_18 + 1,wmode + -1,local_18 + 1,wmode + -1,local_18,
                             wmode + 1,local_18 + -1);
        break;
      case '\x06':
        loc._4_4_ = set_corn(lev,wmode + 1,local_18,wmode + 1,local_18 + 1,wmode,local_18 + 1,
                             wmode + -1,local_18 + -1);
        break;
      case '\a':
        loc._4_4_ = set_crosswall(lev,wmode,local_18);
        break;
      case '\b':
        loc._4_4_ = set_twall(lev,wmode,local_18,wmode,local_18 + 1,wmode + 1,local_18 + -1,
                              wmode + -1,local_18 + -1);
        break;
      case '\t':
        loc._4_4_ = set_twall(lev,wmode,local_18,wmode,local_18 + -1,wmode + -1,local_18 + 1,
                              wmode + 1,local_18 + 1);
        break;
      case '\n':
        loc._4_4_ = set_twall(lev,wmode,local_18,wmode + 1,local_18,wmode + -1,local_18 + -1,
                              wmode + -1,local_18 + 1);
        break;
      case '\v':
        loc._4_4_ = set_twall(lev,wmode,local_18,wmode + -1,local_18,wmode + 1,local_18 + 1,
                              wmode + 1,local_18 + -1);
        break;
      default:
        loc._4_4_ = 0xffffffff;
        break;
      case '\x0f':
        loc._4_4_ = set_wall(lev,wmode,local_18,*(uint *)&local_28->field_0x6 >> 9 & 1);
      }
      if (-1 < (int)loc._4_4_) {
        *(uint *)&local_28->field_0x6 =
             *(uint *)&local_28->field_0x6 & 0xfffffe0f |
             (*(uint *)&local_28->field_0x6 >> 4 & 0x18 | loc._4_4_ & 0x1f) << 4;
      }
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void set_wall_state(struct level *lev)
{
    int x, y;
    int wmode;
    struct rm *loc;

    for (x = 0; x < COLNO; x++)
	for (loc = &lev->locations[x][0], y = 0; y < ROWNO; y++, loc++) {
	    switch (loc->typ) {
		case SDOOR:
		    wmode = set_wall(lev, x, y, (int) loc->horizontal);
		    break;
		case VWALL:
		    wmode = set_wall(lev, x, y, 0);
		    break;
		case HWALL:
		    wmode = set_wall(lev, x, y, 1);
		    break;
		case TDWALL:
		    wmode = set_twall(lev, x,y, x,y-1, x-1,y+1, x+1,y+1);
		    break;
		case TUWALL:
		    wmode = set_twall(lev, x,y, x,y+1, x+1,y-1, x-1,y-1);
		    break;
		case TLWALL:
		    wmode = set_twall(lev, x,y, x+1,y, x-1,y-1, x-1,y+1);
		    break;
		case TRWALL:
		    wmode = set_twall(lev, x,y, x-1,y, x+1,y+1, x+1,y-1);
		    break;
		case TLCORNER:
		    wmode = set_corn(lev, x-1,y-1, x,y-1, x-1,y, x+1,y+1);
		    break;
		case TRCORNER:
		    wmode = set_corn(lev, x,y-1, x+1,y-1, x+1,y, x-1,y+1);
		    break;
		case BLCORNER:
		    wmode = set_corn(lev, x,y+1, x-1,y+1, x-1,y, x+1,y-1);
		    break;
		case BRCORNER:
		    wmode = set_corn(lev, x+1,y, x+1,y+1, x,y+1, x-1,y-1);
		    break;
		case CROSSWALL:
		    wmode = set_crosswall(lev, x, y);
		    break;

		default:
		    wmode = -1;	/* don't set wall info */
		    break;
	    }

	if (wmode >= 0)
	    loc->wall_info = (loc->wall_info & ~WM_MASK) | wmode;
	}
}